

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::ZConsVisitor::visit(ZConsVisitor *this,RigidBody *rb)

{
  bool bVar1;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms;
  string prefix;
  _Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_78;
  string local_58;
  _Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&local_38,&rb->atoms_);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::_M_move_assign
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&local_78,&local_38);
  std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base(&local_38);
  bVar1 = isZconstraint(this,((*local_78._M_impl.super__Vector_impl_data._M_start)->
                             super_StuntDouble).globalIndex_,&local_58);
  if (bVar1) {
    internalVisit(this,&rb->super_StuntDouble,&local_58);
  }
  std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base(&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void ZConsVisitor::visit(RigidBody* rb) {
    std::string prefix;
    std::vector<Atom*> atoms;

    atoms = rb->getAtoms();

    if (isZconstraint(atoms[0]->getGlobalIndex(), prefix))
      internalVisit(rb, prefix);
  }